

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nativefunction.cpp
# Opt level: O3

void sos::NativeFunction::greaterEqual(VariableStack *stack)

{
  int iVar1;
  _Alloc_hider _Var2;
  int *piVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  int local_5c;
  char *local_58;
  string local_50;
  
  VariableStack::take_abi_cxx11_(&local_50,stack);
  _Var2._M_p = local_50._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(_Var2._M_p,&local_58,10);
  if (local_58 == _Var2._M_p) {
    std::__throw_invalid_argument("stoi");
LAB_00106c5e:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar4 != lVar4) || (*piVar3 == 0x22)) goto LAB_00106c5e;
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    VariableStack::take_abi_cxx11_(&local_50,stack);
    _Var2._M_p = local_50._M_dataplus._M_p;
    local_5c = *piVar3;
    *piVar3 = 0;
    lVar5 = strtol(local_50._M_dataplus._M_p,&local_58,10);
    if (local_58 != _Var2._M_p) {
      if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = local_5c;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        VariableStack::load(stack,(int)lVar5 <= (int)lVar4);
        return;
      }
      goto LAB_00106c76;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00106c76:
  uVar6 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = local_5c;
  }
  greaterEqual();
  _Unwind_Resume(uVar6);
}

Assistant:

void sos::NativeFunction::greaterEqual(sos::VariableStack *stack) {
    int left = std::stoi(stack->take());
    int right = std::stoi(stack->take());
    stack->load(left >= right);
}